

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void FreeDeviceTree(VGM_BASEDEV *cBaseDev,UINT8 freeBase)

{
  VGM_BASEDEV *pVVar1;
  VGM_BASEDEV *cDevCur;
  VGM_BASEDEV *devInf;
  
  devInf = cBaseDev;
  if (cBaseDev != (VGM_BASEDEV *)0x0) {
    do {
      if ((devInf->defInf).dataPtr != (DEV_DATA *)0x0) {
        Resmpl_Deinit(&devInf->resmpl);
        SndEmu_Stop(&devInf->defInf);
      }
      SndEmu_FreeDevLinkData(&devInf->defInf);
      pVVar1 = devInf->linkDev;
      if (devInf == cBaseDev && freeBase == '\0') {
        devInf->linkDev = (VGM_BASEDEV *)0x0;
      }
      else {
        free(devInf);
      }
      devInf = pVVar1;
    } while (pVVar1 != (VGM_BASEDEV *)0x0);
  }
  return;
}

Assistant:

void FreeDeviceTree(VGM_BASEDEV* cBaseDev, UINT8 freeBase)
{
	VGM_BASEDEV* cDevCur;
	VGM_BASEDEV* cDevOld;
	
	cDevCur = cBaseDev;
	while(cDevCur != NULL)
	{
		if (cDevCur->defInf.dataPtr != NULL)
		{
			Resmpl_Deinit(&cDevCur->resmpl);
			SndEmu_Stop(&cDevCur->defInf);
		}
		SndEmu_FreeDevLinkData(&cDevCur->defInf);
		cDevOld = cDevCur;
		cDevCur = cDevCur->linkDev;
		if (cDevOld == cBaseDev && ! freeBase)
			cDevOld->linkDev = NULL;
		else
			free(cDevOld);
	}
	
	return;
}